

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Const::set_is_packed(Const *this,bool value)

{
  UserException *this_00;
  undefined7 in_register_00000031;
  string local_40;
  allocator<char> local_19;
  
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Unable to set const unpacked",&local_19);
  UserException::UserException(this_00,&local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Const::set_is_packed(bool value) {
    if (!value) throw UserException("Unable to set const unpacked");
}